

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall kratos::InitValueVisitor::visit(InitValueVisitor *this,Generator *gen)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::AssignStmt> assign;
  
  psVar1 = (gen->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (gen->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->fn_;
  for (lVar3 = 0; (long)psVar1 - (long)psVar2 >> 4 != lVar3; lVar3 = lVar3 + 1) {
    Generator::get_stmt((Generator *)local_58,(uint32_t)gen);
    if (*(int *)((long)local_58 + 0x78) == 3) {
      Stmt::as<kratos::AssignStmt>
                ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (*(int *)(*(long *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[0xc]._M_use_count + 0x168) == 3) {
        std::function<void_(kratos::AssignStmt_*)>::operator()
                  ((function<void_(kratos::AssignStmt_*)> *)
                   assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
                   (AssignStmt *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  return;
}

Assistant:

void visit(Generator *gen) override {
        uint64_t stmt_count = gen->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign = stmt->as<AssignStmt>();
                if (assign->right()->type() == VarType::ConstValue) {
                    fn_(assign.get());
                }
            }
        }
    }